

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::
     functor_manager<boost::_bi::bind_t<void,_boost::_mfi::mf1<void,_boost::unit_test::test_observer,_unsigned_long>,_boost::_bi::list2<boost::_bi::value<boost::unit_test::test_observer_*>,_boost::_bi::value<boost::unit_test::test_case_counter::readonly_property39>_>_>_>
     ::manager(long *in_buffer,long *out_buffer,undefined4 op)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 *puVar6;
  pointer_____offset_0x10___ *local_18;
  
  switch(op) {
  case 0:
    puVar1 = (undefined8 *)*in_buffer;
    puVar6 = (undefined8 *)operator_new(0x20);
    uVar2 = puVar1[1];
    uVar3 = puVar1[2];
    uVar4 = puVar1[3];
    *puVar6 = *puVar1;
    puVar6[1] = uVar2;
    puVar6[2] = uVar3;
    puVar6[3] = uVar4;
    goto LAB_001a72a3;
  case 1:
    *out_buffer = *in_buffer;
    *in_buffer = 0;
    break;
  case 2:
    operator_delete((void *)*out_buffer,0x20);
LAB_001a72a8:
    *out_buffer = 0;
    break;
  case 3:
    local_18 = &_bi::
                bind_t<void,boost::_mfi::mf1<void,boost::unit_test::test_observer,unsigned_long>,boost::_bi::list2<boost::_bi::value<boost::unit_test::test_observer*>,boost::_bi::value<boost::unit_test::test_case_counter::readonly_property39>>>
                ::typeinfo;
    bVar5 = typeindex::operator==
                      ((type_info *)*out_buffer,
                       (type_index_facade<boost::typeindex::stl_type_index,_std::type_info> *)
                       &local_18);
    if (!bVar5) goto LAB_001a72a8;
    puVar6 = (undefined8 *)*in_buffer;
LAB_001a72a3:
    *out_buffer = (long)puVar6;
    break;
  default:
    *out_buffer = (long)&_bi::
                         bind_t<void,boost::_mfi::mf1<void,boost::unit_test::test_observer,unsigned_long>,boost::_bi::list2<boost::_bi::value<boost::unit_test::test_observer*>,boost::_bi::value<boost::unit_test::test_case_counter::readonly_property39>>>
                         ::typeinfo;
    *(undefined2 *)(out_buffer + 1) = 0;
  }
  return;
}

Assistant:

static inline void
        manager(const function_buffer& in_buffer, function_buffer& out_buffer,
                functor_manager_operation_type op, mpl::false_)
        {
          if (op == clone_functor_tag) {
            // Clone the functor
            // GCC 2.95.3 gets the CV qualifiers wrong here, so we
            // can't do the static_cast that we should do.
            // jewillco: Changing this to static_cast because GCC 2.95.3 is
            // obsolete.
            const functor_type* f =
              static_cast<const functor_type*>(in_buffer.members.obj_ptr);
            functor_type* new_f = new functor_type(*f);
            out_buffer.members.obj_ptr = new_f;
          } else if (op == move_functor_tag) {
            out_buffer.members.obj_ptr = in_buffer.members.obj_ptr;
            in_buffer.members.obj_ptr = 0;
          } else if (op == destroy_functor_tag) {
            /* Cast from the void pointer to the functor pointer type */
            functor_type* f =
              static_cast<functor_type*>(out_buffer.members.obj_ptr);
            delete f;
            out_buffer.members.obj_ptr = 0;
          } else if (op == check_functor_type_tag) {
            if (*out_buffer.members.type.type == boost::typeindex::type_id<Functor>())
              out_buffer.members.obj_ptr = in_buffer.members.obj_ptr;
            else
              out_buffer.members.obj_ptr = 0;
          } else /* op == get_functor_type_tag */ {
            out_buffer.members.type.type = &boost::typeindex::type_id<Functor>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
          }
        }